

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

iterator __thiscall
phmap::priv::
btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
::insert(btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
         *this,value_type *x)

{
  size_type *psVar1;
  value_type vVar2;
  undefined1 auVar3 [12];
  btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
  *this_00;
  btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
  bVar4;
  _Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  _Var5;
  ulong uVar6;
  btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
  *pbVar7;
  btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
  bVar8;
  byte bVar9;
  ulong uVar10;
  allocator_type *alloc;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong uVar11;
  iterator iVar12;
  iterator iVar13;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>,_int_&,_int_*>
  local_38;
  
  if ((this->
      super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
      ).tree_.size_ == 0) {
    _Var5.
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
    ._M_head_impl =
         (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
          )btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
           ::new_leaf_root_node
                     ((btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
                       *)this,1);
    (this->
    super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
    ).tree_.rightmost_ =
         (node_type *)
         _Var5.
         super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
         ._M_head_impl;
    (this->
    super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
    ).tree_.root_.
    super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
    .
    super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
         = _Var5.
           super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
           ._M_head_impl;
  }
  iVar12 = btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
           ::internal_upper_bound<int>
                     ((btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
                       *)this,x);
  auVar3 = iVar12._0_12_;
  if (iVar12.node ==
      (btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
       *)0x0) {
    iVar12 = btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
             ::end((btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
                    *)this);
    auVar3 = iVar12._0_12_;
  }
  local_38.node = auVar3._0_8_;
  local_38.position = auVar3._8_4_;
  if ((auVar3 & (undefined1  [12])0x7) == (undefined1  [12])0x0) {
    if (local_38.node[0xb] ==
        (btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
         )0x0) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>,_int_&,_int_*>
      ::operator--(&local_38);
      local_38.position = local_38.position + 1;
    }
    if (((ulong)local_38.node & 7) == 0) {
      bVar4 = local_38.node[0xb];
      uVar10 = (ulong)(byte)bVar4;
      bVar8 = (btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
               )0x3d;
      if (bVar4 != (btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
                    )0x0) {
        bVar8 = bVar4;
      }
      if (local_38.node[10] == bVar8) {
        if ((byte)bVar8 < 0x3d) {
          if (local_38.node !=
              (btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
               *)(this->
                 super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
                 ).tree_.root_.
                 super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                 .
                 super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                 .
                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                 .
                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
             ) {
            __assert_fail("iter.node == root()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xc27,
                          "iterator phmap::priv::btree<phmap::priv::set_params<int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<int>, 256, true>>::internal_emplace(iterator, Args &&...) [Params = phmap::priv::set_params<int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<int>, 256, true>, Args = <int>]"
                         );
          }
          bVar9 = 0x3d;
          if ((byte)((char)bVar8 * '\x02') < 0x3d) {
            bVar9 = (char)bVar8 * '\x02';
          }
          local_38.node =
               btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
               ::new_leaf_root_node
                         ((btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
                           *)this,(uint)bVar9);
          btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
          ::swap(local_38.node,
                 (btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
                  *)(this->
                    super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
                    ).tree_.root_.
                    super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                    .
                    super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                    .
                    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                    .
                    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
                 ,alloc);
          btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
          ::delete_leaf_node((btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
                              *)this,(btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
                                      *)(this->
                                        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
                                        ).tree_.root_.
                                        super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                                        .
                                        super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                                        .
                                        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                                        .
                                        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
                            );
          (this->
          super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
          ).tree_.root_.
          super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
          .
          super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
          .
          super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
          .
          super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
               = (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
                  )local_38.node;
          (this->
          super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
          ).tree_.rightmost_ = local_38.node;
          uVar10 = extraout_RDX;
        }
        else {
          btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
          ::rebalance_or_split
                    ((btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
                      *)this,&local_38);
          uVar10 = extraout_RDX_00;
        }
      }
      this_00 = local_38.node;
      if (((ulong)local_38.node & 7) == 0) {
        uVar11 = (ulong)local_38.position;
        uVar6 = (ulong)(byte)local_38.node[10];
        if (uVar11 <= uVar6) {
          for (; uVar11 < uVar6; uVar6 = uVar6 - 1) {
            *(undefined4 *)(local_38.node + uVar6 * 4 + 0xc) =
                 *(undefined4 *)(local_38.node + uVar6 * 4 + 8);
          }
          vVar2 = *x;
          *(value_type *)(local_38.node + uVar11 * 4 + 0xc) = vVar2;
          bVar4 = (btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
                   )((char)local_38.node[10] + 1);
          pbVar7 = (btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
                    *)(ulong)CONCAT31((int3)((uint)vVar2 >> 8),bVar4);
          local_38.node[10] = bVar4;
          if (local_38.node[0xb] ==
              (btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
               )0x0) {
            uVar11 = uVar11 + 1;
            uVar6 = (ulong)(byte)bVar4;
            if (uVar11 < (byte)bVar4) {
              while ((int)uVar11 < (int)uVar6) {
                uVar10 = (ulong)((int)uVar6 - 1);
                pbVar7 = btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
                         ::child(this_00,uVar10);
                btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
                ::set_child(this_00,uVar6,pbVar7);
                uVar6 = uVar10;
              }
              pbVar7 = (btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
                        *)btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
                          ::mutable_child(this_00,uVar11);
              uVar10 = extraout_RDX_01;
            }
          }
          psVar1 = &(this->
                    super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
                    ).tree_.size_;
          *psVar1 = *psVar1 + 1;
          iVar13._8_8_ = uVar10;
          iVar13.node = pbVar7;
          return iVar13;
        }
        __assert_fail("i <= count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x852,
                      "void phmap::priv::btree_node<phmap::priv::set_params<int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<int>, 256, true>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::set_params<int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<int>, 256, true>, Args = <int>]"
                     );
      }
    }
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<int>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<int>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
}

Assistant:

iterator insert(value_type &&x) {
            return this->tree_.insert_multi(std::move(x));
        }